

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O1

void __thiscall
t_java_generator::generate_deserialize_container
          (t_java_generator *this,ostream *out,t_type *ttype,string *prefix,bool has_metadata)

{
  int *piVar1;
  _func_int *p_Var2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  t_java_generator *this_00;
  char *pcVar8;
  _Alloc_hider _Var9;
  string obj;
  string local_1b0;
  char *local_190;
  long local_188;
  char local_180 [16];
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  local_190 = local_180;
  local_188 = 0;
  local_180[0] = '\0';
  iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar5 == '\0') {
    iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar5 != '\0') {
      paVar7 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"_set","");
      t_generator::tmp(&local_1b0,(t_generator *)this,&local_70);
      std::__cxx11::string::operator=((string *)&local_190,(string *)&local_1b0);
      _Var9._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
        _Var9._M_p = local_70._M_dataplus._M_p;
      }
      goto LAB_00269cb2;
    }
    iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar5 != '\0') {
      paVar7 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"_list","");
      t_generator::tmp(&local_1b0,(t_generator *)this,&local_90);
      std::__cxx11::string::operator=((string *)&local_190,(string *)&local_1b0);
      _Var9._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
        _Var9._M_p = local_90._M_dataplus._M_p;
      }
      goto LAB_00269cb2;
    }
  }
  else {
    paVar7 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_map","");
    t_generator::tmp(&local_1b0,(t_generator *)this,&local_50);
    std::__cxx11::string::operator=((string *)&local_190,(string *)&local_1b0);
    _Var9._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
      _Var9._M_p = local_50._M_dataplus._M_p;
    }
LAB_00269cb2:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p != paVar7) {
      operator_delete(_Var9._M_p);
    }
  }
  p_Var2 = (ttype->super_t_doc)._vptr_t_doc[0x10];
  if (has_metadata) {
    iVar5 = (*p_Var2)(ttype);
    if ((char)iVar5 == '\0') {
      iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
      if ((char)iVar5 == '\0') {
        iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
        if ((char)iVar5 == '\0') goto LAB_0026a075;
        poVar6 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"org.apache.thrift.protocol.TList ",0x21);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_190,local_188);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," = iprot.readListBegin();",0x19);
      }
      else {
        poVar6 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"org.apache.thrift.protocol.TSet ",0x20);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_190,local_188);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," = iprot.readSetBegin();",0x18);
      }
    }
    else {
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"org.apache.thrift.protocol.TMap ",0x20);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_190,local_188);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," = iprot.readMapBegin();",0x18);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    iVar5 = (*p_Var2)(ttype);
    if ((char)iVar5 == '\0') {
      iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
      if ((char)iVar5 == '\0') {
        iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
        if ((char)iVar5 == '\0') goto LAB_0026a075;
        poVar6 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"org.apache.thrift.protocol.TList ",0x21);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_190,local_188);
        pcVar8 = " = iprot.readListBegin(";
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," = iprot.readListBegin(",0x17);
        type_to_enum_abi_cxx11_
                  (&local_1b0,(t_java_generator *)pcVar8,*(t_type **)&ttype[1].super_t_doc.has_doc_)
        ;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      else {
        poVar6 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"org.apache.thrift.protocol.TSet ",0x20);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_190,local_188);
        pcVar8 = " = iprot.readSetBegin(";
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," = iprot.readSetBegin(",0x16);
        type_to_enum_abi_cxx11_
                  (&local_1b0,(t_java_generator *)pcVar8,*(t_type **)&ttype[1].super_t_doc.has_doc_)
        ;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
    }
    else {
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"org.apache.thrift.protocol.TMap ",0x20);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_190,local_188);
      pcVar8 = " = iprot.readMapBegin(";
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," = iprot.readMapBegin(",0x16);
      type_to_enum_abi_cxx11_
                (&local_1b0,(t_java_generator *)pcVar8,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
      this_00 = (t_java_generator *)0x3a9b9f;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      type_to_enum_abi_cxx11_(&local_170,this_00,*(t_type **)&ttype[1].annotations_._M_t._M_impl);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_170._M_dataplus._M_p,local_170._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"); ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
  }
LAB_0026a075:
  if (this->reuse_objects_ == true) {
    poVar6 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"if (",4);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," == null) {",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
  }
  bVar4 = is_enum_set(this,ttype);
  if (bVar4) {
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
    type_name_abi_cxx11_(&local_170,this,ttype,false,true,true,false);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".noneOf",7);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," = new ",7);
    type_name_abi_cxx11_(&local_170,this,ttype,false,true,false,false);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_170._M_dataplus._M_p,local_170._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  bVar4 = is_enum_set(this,ttype);
  if ((bVar4) || (bVar4 = is_enum_map(this,ttype), bVar4)) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
    inner_enum_type_name_abi_cxx11_(&local_1b0,this,ttype);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
  }
  else {
    if ((this->sorted_containers_ == true) &&
       ((iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype), (char)iVar5 != '\0' ||
        (iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype), (char)iVar5 != '\0')))) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"();",3);
      poVar6 = out;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
      iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      pcVar8 = "2*";
      if ((byte)iVar5 != 0) {
        pcVar8 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (out,pcVar8,(ulong)((uint)(byte)((byte)iVar5 ^ 1) * 2));
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(out,local_190,local_188);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,".size",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,");",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if (this->reuse_objects_ == true) {
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar6 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar5 == '\0') {
    iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar5 != '\0') {
      paVar7 = &local_f0.field_2;
      pcVar3 = (prefix->_M_dataplus)._M_p;
      local_f0._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar3,pcVar3 + prefix->_M_string_length);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,local_190,local_190 + local_188);
      generate_deserialize_set_element(this,out,(t_set *)ttype,&local_f0,&local_110,has_metadata);
      _Var9._M_p = local_f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
        _Var9._M_p = local_f0._M_dataplus._M_p;
      }
      goto LAB_0026a5bc;
    }
    iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar5 != '\0') {
      paVar7 = &local_130.field_2;
      pcVar3 = (prefix->_M_dataplus)._M_p;
      local_130._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar3,pcVar3 + prefix->_M_string_length);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,local_190,local_190 + local_188);
      generate_deserialize_list_element(this,out,(t_list *)ttype,&local_130,&local_150,has_metadata)
      ;
      _Var9._M_p = local_130._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
        _Var9._M_p = local_130._M_dataplus._M_p;
      }
      goto LAB_0026a5bc;
    }
  }
  else {
    paVar7 = &local_b0.field_2;
    pcVar3 = (prefix->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar3,pcVar3 + prefix->_M_string_length);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_190,local_190 + local_188);
    generate_deserialize_map_element(this,out,(t_map *)ttype,&local_b0,&local_d0,has_metadata);
    _Var9._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
      _Var9._M_p = local_b0._M_dataplus._M_p;
    }
LAB_0026a5bc:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p != paVar7) {
      operator_delete(_Var9._M_p);
    }
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  if (has_metadata) {
    iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
    if ((char)iVar5 == '\0') {
      iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
      if ((char)iVar5 == '\0') {
        iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
        if ((char)iVar5 == '\0') goto LAB_0026a686;
        poVar6 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"iprot.readListEnd();",0x14);
      }
      else {
        poVar6 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"iprot.readSetEnd();",0x13);
      }
    }
    else {
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"iprot.readMapEnd();",0x13);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
LAB_0026a686:
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  if (local_190 != local_180) {
    operator_delete(local_190);
  }
  return;
}

Assistant:

void t_java_generator::generate_deserialize_container(ostream& out,
                                                      t_type* ttype,
                                                      string prefix,
                                                      bool has_metadata) {

  scope_up(out);

  string obj;

  if (ttype->is_map()) {
    obj = tmp("_map");
  } else if (ttype->is_set()) {
    obj = tmp("_set");
  } else if (ttype->is_list()) {
    obj = tmp("_list");
  }

  if (has_metadata) {
    // Declare variables, read header
    if (ttype->is_map()) {
      indent(out) << "org.apache.thrift.protocol.TMap " << obj << " = iprot.readMapBegin();"
                  << endl;
    } else if (ttype->is_set()) {
      indent(out) << "org.apache.thrift.protocol.TSet " << obj << " = iprot.readSetBegin();"
                  << endl;
    } else if (ttype->is_list()) {
      indent(out) << "org.apache.thrift.protocol.TList " << obj << " = iprot.readListBegin();"
                  << endl;
    }
  } else {
    // Declare variables, read header
    if (ttype->is_map()) {
      indent(out) << "org.apache.thrift.protocol.TMap " << obj
                  << " = iprot.readMapBegin("
                  << type_to_enum(((t_map*)ttype)->get_key_type()) << ", "
                  << type_to_enum(((t_map*)ttype)->get_val_type()) << "); "<< endl;
    } else if (ttype->is_set()) {
      indent(out) << "org.apache.thrift.protocol.TSet " << obj
                  << " = iprot.readSetBegin("
                  << type_to_enum(((t_set*)ttype)->get_elem_type()) << ");"
                  << endl;
    } else if (ttype->is_list()) {
      indent(out) << "org.apache.thrift.protocol.TList " << obj
                  << " = iprot.readListBegin("
                  << type_to_enum(((t_list*)ttype)->get_elem_type()) << ");"
                  << endl;
    }
  }

  if (reuse_objects_) {
    indent(out) << "if (" << prefix << " == null) {" << endl;
    indent_up();
  }

  if (is_enum_set(ttype)) {
    out << indent() << prefix << " = " << type_name(ttype, false, true, true) << ".noneOf";
  } else {
    out << indent() << prefix << " = new " << type_name(ttype, false, true);
  }

  // construct the collection correctly i.e. with appropriate size/type
  if (is_enum_set(ttype) || is_enum_map(ttype)) {
    out << "(" << inner_enum_type_name(ttype) << ");" << endl;
  } else if (sorted_containers_ && (ttype->is_map() || ttype->is_set())) {
    // TreeSet and TreeMap don't have any constructor which takes a capacity as an argument
    out << "();" << endl;
  } else {
    out << "(" << (ttype->is_list() ? "" : "2*") << obj << ".size"
        << ");" << endl;
  }

  if (reuse_objects_) {
    indent_down();
    indent(out) << "}" << endl;
  }

  if (ttype->is_map()) {
    generate_deserialize_map_element(out, (t_map*)ttype, prefix, obj, has_metadata);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, prefix, obj, has_metadata);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, prefix, obj, has_metadata);
  }

  scope_down(out);

  if (has_metadata) {
    // Read container end
    if (ttype->is_map()) {
      indent(out) << "iprot.readMapEnd();" << endl;
    } else if (ttype->is_set()) {
      indent(out) << "iprot.readSetEnd();" << endl;
    } else if (ttype->is_list()) {
      indent(out) << "iprot.readListEnd();" << endl;
    }
  }
  scope_down(out);
}